

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QArrayDataPointer<QHeaderViewPrivate::SectionItem> * __thiscall
QArrayDataPointer<QHeaderViewPrivate::SectionItem>::operator=
          (QArrayDataPointer<QHeaderViewPrivate::SectionItem> *this,
          QArrayDataPointer<QHeaderViewPrivate::SectionItem> *other)

{
  Data *pDVar1;
  SectionItem *pSVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  
  pDVar1 = other->d;
  pSVar2 = other->ptr;
  qVar3 = other->size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar4 = &this->d->super_QArrayData;
  this->d = pDVar1;
  this->ptr = pSVar2;
  this->size = qVar3;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,8,0x10);
    }
  }
  return this;
}

Assistant:

QArrayDataPointer &operator=(const QArrayDataPointer &other) noexcept
    {
        QArrayDataPointer tmp(other);
        this->swap(tmp);
        return *this;
    }